

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

PagesConfig * __thiscall QPDFJob::PagesConfig::range(PagesConfig *this,string *arg)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  allocator<char> local_79;
  string local_78;
  reference local_58;
  value_type *last;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *arg_local;
  PagesConfig *this_local;
  
  local_18 = arg;
  arg_local = (string *)this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->config->o);
  bVar1 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::empty
                    (&peVar2->page_specs);
  if (bVar1) {
    QTC::TC("qpdf","QPDFJob misplaced page range",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"in --range must follow a file name",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->config->o);
  local_58 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::back
                       (&peVar2->page_specs);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    QTC::TC("qpdf","QPDFJob duplicated range",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"--range already specified for this file",&local_79);
    usage(&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::operator=((string *)&local_58->range,(string *)local_18);
  return this;
}

Assistant:

QPDFJob::PagesConfig*
QPDFJob::PagesConfig::range(std::string const& arg)
{
    if (config->o.m->page_specs.empty()) {
        QTC::TC("qpdf", "QPDFJob misplaced page range");
        usage("in --range must follow a file name");
    }
    auto& last = config->o.m->page_specs.back();
    if (!last.range.empty()) {
        QTC::TC("qpdf", "QPDFJob duplicated range");
        usage("--range already specified for this file");
    }
    last.range = arg;
    return this;
}